

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

bool __thiscall
caffe::EmbedParameter::MergePartialFromCodedStream(EmbedParameter *this,CodedInputStream *input)

{
  byte bVar1;
  void *pvVar2;
  uint8 *puVar3;
  bool bVar4;
  int length;
  uint32 uVar5;
  int byte_limit;
  FillerParameter *this_00;
  unsigned_long uVar6;
  byte *pbVar7;
  pair<int,_int> pVar8;
  long lVar9;
  UnknownFieldSet *unknown_fields;
  char cVar10;
  uint tag;
  ulong uVar11;
  pair<unsigned_long,_bool> pVar12;
  
LAB_0040e4c2:
  pbVar7 = input->buffer_;
  uVar5 = 0;
  if (pbVar7 < input->buffer_end_) {
    bVar1 = *pbVar7;
    uVar5 = (uint32)bVar1;
    if ((char)bVar1 < '\x01') goto LAB_0040e4e6;
    input->buffer_ = pbVar7 + 1;
    uVar11 = (ulong)bVar1 | 0x100000000;
  }
  else {
LAB_0040e4e6:
    uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
    uVar11 = 0;
    if (uVar5 - 1 < 0x7f) {
      uVar11 = 0x100000000;
    }
    uVar11 = uVar5 | uVar11;
  }
  tag = (uint)uVar11;
  if ((uVar11 & 0x100000000) == 0) goto switchD_0040e55b_default;
  cVar10 = (char)uVar11;
  switch((uint)(uVar11 >> 3) & 0x1fffffff) {
  case 1:
    if (cVar10 != '\b') break;
    *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
    pbVar7 = input->buffer_;
    if (pbVar7 < input->buffer_end_) {
      bVar1 = *pbVar7;
      uVar5 = (uint32)bVar1;
      if (-1 < (char)bVar1) {
        this->num_output_ = (uint)bVar1;
LAB_0040e66a:
        input->buffer_ = pbVar7 + 1;
        goto LAB_0040e4c2;
      }
    }
    else {
      uVar5 = 0;
    }
    lVar9 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
    this->num_output_ = (uint32)lVar9;
LAB_0040e70a:
    if (lVar9 < 0) {
      return false;
    }
    goto LAB_0040e4c2;
  case 2:
    if (cVar10 == '\x10') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      pbVar7 = input->buffer_;
      if (pbVar7 < input->buffer_end_) {
        bVar1 = *pbVar7;
        uVar5 = (uint32)bVar1;
        if (-1 < (char)bVar1) {
          this->input_dim_ = (uint)bVar1;
          goto LAB_0040e66a;
        }
      }
      else {
        uVar5 = 0;
      }
      lVar9 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
      this->input_dim_ = (uint32)lVar9;
      goto LAB_0040e70a;
    }
    break;
  case 3:
    if (cVar10 == '\x18') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (uVar6 = (unsigned_long)(char)*puVar3, -1 < (long)uVar6))
      {
        input->buffer_ = puVar3 + 1;
      }
      else {
        pVar12 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar6 = pVar12.first;
        if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->bias_term_ = uVar6 != 0;
      goto LAB_0040e4c2;
    }
    break;
  case 4:
    if (cVar10 != '\"') break;
    *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
    this_00 = this->weight_filler_;
    if (this_00 == (FillerParameter *)0x0) {
      this_00 = (FillerParameter *)operator_new(0x40);
      FillerParameter::FillerParameter(this_00);
      this->weight_filler_ = this_00;
    }
LAB_0040e626:
    puVar3 = input->buffer_;
    if ((puVar3 < input->buffer_end_) && (byte_limit = (int)(char)*puVar3, -1 < byte_limit)) {
      input->buffer_ = puVar3 + 1;
    }
    else {
      byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
      if (byte_limit < 0) {
        return false;
      }
    }
    pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                      (input,byte_limit);
    if ((long)pVar8 < 0) {
      return false;
    }
    bVar4 = FillerParameter::MergePartialFromCodedStream(this_00,input);
    if (!bVar4) {
      return false;
    }
    bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                      (input,pVar8.first);
    goto joined_r0x0040e6ba;
  case 5:
    if (cVar10 == '*') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      this_00 = this->bias_filler_;
      if (this_00 == (FillerParameter *)0x0) {
        this_00 = (FillerParameter *)operator_new(0x40);
        FillerParameter::FillerParameter(this_00);
        this->bias_filler_ = this_00;
      }
      goto LAB_0040e626;
    }
  }
switchD_0040e55b_default:
  if (tag == 0) {
    return true;
  }
  if ((tag & 7) == 4) {
    return true;
  }
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) == 0) {
    unknown_fields =
         google::protobuf::internal::
         InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
         ::mutable_unknown_fields_slow
                   (&(this->_internal_metadata_).
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   );
  }
  else {
    unknown_fields = (UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe);
  }
  bVar4 = google::protobuf::internal::WireFormat::SkipField(input,tag,unknown_fields);
joined_r0x0040e6ba:
  if (!bVar4) {
    return false;
  }
  goto LAB_0040e4c2;
}

Assistant:

bool EmbedParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.EmbedParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional uint32 num_output = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          set_has_num_output();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &num_output_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 input_dim = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_input_dim();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &input_dim_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool bias_term = 3 [default = true];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_bias_term();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &bias_term_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.FillerParameter weight_filler = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_weight_filler()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.FillerParameter bias_filler = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bias_filler()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.EmbedParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.EmbedParameter)
  return false;
#undef DO_
}